

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

BCRec * __thiscall amrex::StateData::getBC(StateData *this,int comp,int i)

{
  int *piVar1;
  long in_RSI;
  BCRec *in_RDI;
  BCRec *bcr;
  int dir;
  int *dhi;
  int *dlo;
  int *bxhi;
  int *bxlo;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar2;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Box local_b4;
  int local_84;
  int *local_78;
  int *local_70;
  int *local_68;
  BCRec *local_60;
  BCRec *local_58;
  Box *local_50;
  Box *local_48;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  BCRec::BCRec(in_RDI);
  BoxArray::operator[]
            ((BoxArray *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),iVar2);
  local_58 = StateDescriptor::getBC
                       ((StateDescriptor *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc);
  local_48 = &local_b4;
  local_60 = in_RDI;
  local_50 = (Box *)(in_RSI + 0x10);
  local_68 = Box::loVect(local_48);
  local_70 = Box::hiVect(local_48);
  local_78 = Box::loVect(local_50);
  piVar1 = Box::hiVect(local_50);
  for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
    if (local_78[local_84] < local_68[local_84]) {
      iVar2 = 0;
    }
    else {
      iVar2 = local_58->bc[local_84];
    }
    local_60->bc[local_84] = iVar2;
    if (local_70[local_84] < piVar1[local_84]) {
      iVar2 = 0;
    }
    else {
      iVar2 = local_58->bc[local_84 + 3];
    }
    local_60->bc[local_84 + 3] = iVar2;
  }
  return in_RDI;
}

Assistant:

BCRec
StateData::getBC (int comp, int i) const noexcept
{
    BCRec bcr;
    amrex::setBC(grids[i],domain,desc->getBC(comp),bcr);
    return bcr;
}